

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wdgl.cpp
# Opt level: O2

void * rw::wdgl::driverOpen(void *o,int32 param_2,int32 param_3)

{
  ObjPipeline *pOVar1;
  
  pOVar1 = ObjPipeline::create();
  **(undefined8 **)(engine + 0xb0) = pOVar1;
  return o;
}

Assistant:

static void*
driverOpen(void *o, int32, int32)
{
	engine->driver[PLATFORM_WDGL]->defaultPipeline = makeDefaultPipeline();
	return o;
}